

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_sub_string(JSContext *ctx,JSString *p,int start,int end)

{
  JSValue v;
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  uint in_ECX;
  int in_EDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  uint16_t c;
  int i;
  JSString *str;
  int len;
  ushort local_4e;
  int in_stack_ffffffffffffffb4;
  uint16_t *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  JSContext *in_stack_ffffffffffffffc8;
  JSValueUnion local_10;
  int64_t local_8;
  
  iVar1 = in_ECX - in_EDX;
  if ((in_EDX == 0) && (in_ECX == ((uint)*(undefined8 *)((long)in_RSI.ptr + 4) & 0x7fffffff))) {
    v.tag = -7;
    v.u.ptr = in_RSI.ptr;
    _local_10 = JS_DupValue(in_RDI,v);
  }
  else if (((*(ulong *)((long)in_RSI.ptr + 4) >> 0x1f & 1) == 0) || (iVar1 < 1)) {
    _local_10 = js_new_string8((JSContext *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (uint8_t *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  else {
    local_4e = 0;
    for (iVar2 = in_EDX; iVar2 < (int)in_ECX; iVar2 = iVar2 + 1) {
      local_4e = local_4e | *(ushort *)((long)in_RSI.ptr + (long)iVar2 * 2 + 0x10);
    }
    if (local_4e < 0x100) {
      JVar3.ptr = js_alloc_string(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                  in_stack_ffffffffffffffc0);
      if ((JSString *)JVar3.ptr == (JSString *)0x0) {
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 6;
      }
      else {
        for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
          *(char *)((long)JVar3.ptr + (long)iVar2 + 0x10) =
               (char)*(undefined2 *)((long)in_RSI.ptr + (long)(in_EDX + iVar2) * 2 + 0x10);
        }
        *(undefined1 *)((long)JVar3.ptr + (long)iVar1 + 0x10) = 0;
        local_8 = -7;
        local_10.ptr = JVar3.ptr;
      }
    }
    else {
      _local_10 = js_new_string16((JSContext *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8,iVar2);
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_sub_string(JSContext *ctx, JSString *p, int start, int end)
{
    int len = end - start;
    if (start == 0 && end == p->len) {
        return JS_DupValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
    }
    if (p->is_wide_char && len > 0) {
        JSString *str;
        int i;
        uint16_t c = 0;
        for (i = start; i < end; i++) {
            c |= p->u.str16[i];
        }
        if (c > 0xFF)
            return js_new_string16(ctx, p->u.str16 + start, len);

        str = js_alloc_string(ctx, len, 0);
        if (!str)
            return JS_EXCEPTION;
        for (i = 0; i < len; i++) {
            str->u.str8[i] = p->u.str16[start + i];
        }
        str->u.str8[len] = '\0';
        return JS_MKPTR(JS_TAG_STRING, str);
    } else {
        return js_new_string8(ctx, p->u.str8 + start, len);
    }
}